

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test::
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test *this_local;
  
  memset(this,0,0x40);
  TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest::
  TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)
         &
         PTR__TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test_003d4cc8
  ;
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNewArray)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char;
    CHECK(cpputestHasCrashed);
    delete memory;

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}